

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O0

void close_sockets(pmtr_t *cfg)

{
  char *local_c8;
  char *local_b8;
  int *local_a8;
  ulong local_a0;
  ulong local_88;
  int *local_78;
  int *local_70;
  int *local_68;
  ulong local_60;
  ulong local_48;
  int *local_38;
  int *local_30;
  ulong local_28;
  size_t _ut_i_1;
  size_t _ut_i;
  int *fd;
  pmtr_t *cfg_local;
  
  _ut_i = 0;
  while( true ) {
    if (_ut_i == 0) {
      if (cfg->listen->i == 0) {
        local_30 = (int *)0x0;
      }
      else {
        local_30 = (int *)cfg->listen->d;
      }
      local_38 = local_30;
    }
    else {
      if (_ut_i < cfg->listen->d) {
        local_48 = 0xffffffffffffffff;
      }
      else {
        local_48 = (_ut_i - (long)cfg->listen->d) / (cfg->listen->icd).sz;
      }
      if (local_48 + 1 < (ulong)cfg->listen->i) {
        if (_ut_i < cfg->listen->d) {
          local_60 = 0xffffffffffffffff;
        }
        else {
          local_60 = (_ut_i - (long)cfg->listen->d) / (cfg->listen->icd).sz;
        }
        local_68 = (int *)(cfg->listen->d + (cfg->listen->icd).sz * (local_60 + 1));
      }
      else {
        local_68 = (int *)0x0;
      }
      local_38 = local_68;
    }
    _ut_i = (size_t)local_38;
    if (local_38 == (int *)0x0) break;
    close(*local_38);
  }
  _ut_i = 0;
  while( true ) {
    if (_ut_i == 0) {
      if (cfg->report->i == 0) {
        local_70 = (int *)0x0;
      }
      else {
        local_70 = (int *)cfg->report->d;
      }
      local_78 = local_70;
    }
    else {
      if (_ut_i < cfg->report->d) {
        local_88 = 0xffffffffffffffff;
      }
      else {
        local_88 = (_ut_i - (long)cfg->report->d) / (cfg->report->icd).sz;
      }
      if (local_88 + 1 < (ulong)cfg->report->i) {
        if (_ut_i < cfg->report->d) {
          local_a0 = 0xffffffffffffffff;
        }
        else {
          local_a0 = (_ut_i - (long)cfg->report->d) / (cfg->report->icd).sz;
        }
        local_a8 = (int *)(cfg->report->d + (cfg->report->icd).sz * (local_a0 + 1));
      }
      else {
        local_a8 = (int *)0x0;
      }
      local_78 = local_a8;
    }
    _ut_i = (size_t)local_78;
    if (local_78 == (int *)0x0) break;
    close(*local_78);
  }
  if (cfg->listen->i != 0) {
    if ((cfg->listen->icd).dtor != (undefined1 *)0x0) {
      for (_ut_i_1 = 0; _ut_i_1 < cfg->listen->i; _ut_i_1 = _ut_i_1 + 1) {
        if (_ut_i_1 < cfg->listen->i) {
          local_b8 = cfg->listen->d + (cfg->listen->icd).sz * _ut_i_1;
        }
        else {
          local_b8 = (char *)0x0;
        }
        (*(code *)(cfg->listen->icd).dtor)(local_b8);
      }
    }
    cfg->listen->i = 0;
  }
  if (cfg->report->i != 0) {
    if ((cfg->report->icd).dtor != (undefined1 *)0x0) {
      for (local_28 = 0; local_28 < cfg->report->i; local_28 = local_28 + 1) {
        if (local_28 < cfg->report->i) {
          local_c8 = cfg->report->d + (cfg->report->icd).sz * local_28;
        }
        else {
          local_c8 = (char *)0x0;
        }
        (*(code *)(cfg->report->icd).dtor)(local_c8);
      }
    }
    cfg->report->i = 0;
  }
  return;
}

Assistant:

void close_sockets(pmtr_t *cfg) {
  int *fd;
  fd=NULL; while( (fd=(int*)utarray_next(cfg->listen,fd))) close(*fd);
  fd=NULL; while( (fd=(int*)utarray_next(cfg->report,fd))) close(*fd);
  utarray_clear(cfg->listen);
  utarray_clear(cfg->report);
}